

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

JSON * __thiscall chaiscript::json::JSON::operator[](JSON *this,size_t index)

{
  variant_alternative_t<2UL,_variant<std::nullptr_t,_QuickFlatMap<basic_string<char,_char_traits<char>,_allocator<char>_>,_JSON,_equal_to<void>_>,_vector<JSON,_allocator<JSON>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_double,_long,_bool>_>
  *this_00;
  pointer pJVar1;
  ulong uVar2;
  
  Internal::set_type(&this->internal,Array);
  this_00 = std::
            get<2ul,decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
                      ((variant<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                        *)this);
  pJVar1 = (this_00->
           super__Vector_base<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this_00->
                 super__Vector_base<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pJVar1 >> 3) *
          -0x3333333333333333;
  if (uVar2 < index || uVar2 - index == 0) {
    std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>::resize
              (this_00,index + 1);
    pJVar1 = (this_00->
             super__Vector_base<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>).
             _M_impl.super__Vector_impl_data._M_start;
  }
  return pJVar1 + index;
}

Assistant:

JSON &operator[](const size_t index) {
      auto &vec = internal.Vector();
      if (index >= vec.size()) {
        vec.resize(index + 1);
      }

      return vec.operator[](index);
    }